

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_message.c
# Opt level: O1

char * IoTHubMessage_GetProperty(IOTHUB_MESSAGE_HANDLE msg_handle,char *key)

{
  MAP_RESULT MVar1;
  LOGGER_LOG p_Var2;
  char *pcVar3;
  _Bool key_exists;
  
  if (msg_handle == (IOTHUB_MESSAGE_HANDLE)0x0 || key == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_message.c"
                ,"IoTHubMessage_GetProperty",0x23e,1,
                "invalid parameter (NULL) to IoTHubMessage_GetProperty iotHubMessageHandle=%p, key=%p"
                ,msg_handle,key);
      return (char *)0x0;
    }
  }
  else {
    key_exists = false;
    MVar1 = Map_ContainsKey(msg_handle->properties,key,&key_exists);
    if ((MVar1 == MAP_OK) && (key_exists == true)) {
      pcVar3 = Map_GetValueFromKey(msg_handle->properties,key);
      return pcVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* IoTHubMessage_GetProperty(IOTHUB_MESSAGE_HANDLE msg_handle, const char* key)
{
    const char* result;
    if (msg_handle == NULL || key == NULL)
    {
        LogError("invalid parameter (NULL) to IoTHubMessage_GetProperty iotHubMessageHandle=%p, key=%p", msg_handle, key);
        result = NULL;
    }
    else
    {
        bool key_exists = false;
        // The return value is not necessary, just check the key_exist variable
        if ((Map_ContainsKey(msg_handle->properties, key, &key_exists) == MAP_OK) && key_exists)
        {
            result = Map_GetValueFromKey(msg_handle->properties, key);
        }
        else
        {
            result = NULL;
        }
    }
    return result;
}